

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdLut.c
# Opt level: O1

void Sbd_ProblemCollectSolution(int nStrs,Sbd_Str_t *pStr0,Vec_Int_t *vLits)

{
  word wVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  Sbd_Str_t *pSVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  bool bVar15;
  
  if (nStrs < 1) {
    iVar4 = 0;
  }
  else {
    pSVar6 = pStr0 + nStrs;
    uVar5 = 0;
    do {
      pStr0->Res = 0;
      uVar7 = pStr0->nVarIns;
      iVar4 = (int)uVar5;
      if (pStr0->fLut == 0) {
        iVar13 = 0;
        bVar15 = false;
        if (0 < (int)uVar7) {
          uVar3 = 0;
          do {
            if ((iVar4 < 0) || (vLits->nSize <= iVar4 + (int)uVar3)) goto LAB_00544c92;
            if (vLits->pArray[uVar5 + uVar3] < 0) goto LAB_00544cb1;
            if ((vLits->pArray[uVar5 + uVar3] & 1U) == 0) {
              pStr0->Res = (long)pStr0->VarIns[uVar3];
              iVar13 = iVar13 + 1;
            }
            uVar3 = uVar3 + 1;
          } while (uVar7 != uVar3);
          bVar15 = iVar13 == 1;
          uVar5 = (ulong)(uVar7 + iVar4);
        }
        if (!bVar15) {
          __assert_fail("nIters == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdLut.c"
                        ,0xaa,"void Sbd_ProblemCollectSolution(int, Sbd_Str_t *, Vec_Int_t *)");
        }
      }
      else {
        if (uVar7 != 0x1f) {
          iVar13 = 1 << ((byte)uVar7 & 0x1f);
          if (iVar13 < 2) {
            iVar13 = 1;
          }
          uVar3 = 0;
          do {
            if ((iVar4 < 0) || (vLits->nSize <= iVar4 + (int)uVar3)) {
LAB_00544c92:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            if (vLits->pArray[uVar5 + uVar3] < 0) {
LAB_00544cb1:
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                            ,0x130,"int Abc_LitIsCompl(int)");
            }
            if ((vLits->pArray[uVar5 + uVar3] & 1U) == 0) {
              *(ulong *)(pStr0->VarIns + (uVar3 >> 6 & 0x3ffffff) * 2 + 10) =
                   *(ulong *)(pStr0->VarIns + (uVar3 >> 6 & 0x3ffffff) * 2 + 10) |
                   1L << ((byte)uVar3 & 0x3f);
            }
            uVar3 = uVar3 + 1;
          } while (iVar13 != (int)uVar3);
          uVar5 = (ulong)(uint)(iVar4 + (int)uVar3);
        }
        if ((int)uVar7 < 0) {
          __assert_fail("nVars >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                        ,0x489,"word Abc_Tt6Stretch(word, int)");
        }
        uVar9 = uVar7;
        if (uVar7 < 2) {
          uVar9 = 2;
        }
        uVar14 = uVar9;
        if (uVar9 == 2) {
          uVar14 = 3;
        }
        uVar12 = uVar14;
        if (uVar14 == 3) {
          uVar12 = 4;
        }
        uVar2 = uVar12;
        if (uVar12 == 4) {
          uVar2 = 5;
        }
        if (1 < uVar2 - 5) {
          __assert_fail("nVars == 6",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                        ,0x496,"word Abc_Tt6Stretch(word, int)");
        }
        uVar10 = (uint)pStr0->Res;
        uVar11 = (uVar10 & 1) * 3;
        if ((ulong)uVar7 != 0) {
          uVar11 = uVar10;
        }
        wVar1 = (ulong)(uVar11 & 3) * 5;
        if (1 < uVar7) {
          wVar1 = pStr0->Res;
        }
        uVar7 = (uint)wVar1 & 0xf;
        uVar3 = (ulong)(uVar7 << 4 | uVar7);
        if (uVar9 != 2) {
          uVar3 = wVar1;
        }
        uVar8 = (ulong)(uint)((int)(uVar3 & 0xff) << 8) | uVar3 & 0xff;
        if (uVar14 != 3) {
          uVar8 = uVar3;
        }
        uVar3 = (ulong)(uint)((int)uVar8 << 0x10) | uVar8 & 0xffff;
        if (uVar12 != 4) {
          uVar3 = uVar8;
        }
        uVar8 = uVar3 << 0x20 | uVar3 & 0xffffffff;
        if (uVar2 != 5) {
          uVar8 = uVar3;
        }
        pStr0->Res = uVar8;
      }
      iVar4 = (int)uVar5;
      pStr0 = pStr0 + 1;
    } while (pStr0 < pSVar6);
  }
  if (iVar4 == vLits->nSize) {
    return;
  }
  __assert_fail("iLit == Vec_IntSize(vLits)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdLut.c"
                ,0xad,"void Sbd_ProblemCollectSolution(int, Sbd_Str_t *, Vec_Int_t *)");
}

Assistant:

void Sbd_ProblemCollectSolution( int nStrs, Sbd_Str_t * pStr0, Vec_Int_t * vLits )
{
    Sbd_Str_t * pStr;
    int m, nIters, iLit = 0;
    for ( pStr = pStr0; pStr < pStr0 + nStrs; pStr++ )
    {
        pStr->Res = 0;
        if ( pStr->fLut )
        {
            nIters = 1 << pStr->nVarIns;
            for ( m = 0; m < nIters; m++, iLit++ )
                if ( !Abc_LitIsCompl(Vec_IntEntry(vLits, iLit)) )
                    Abc_TtSetBit( &pStr->Res, m );
            pStr->Res = Abc_Tt6Stretch( pStr->Res, pStr->nVarIns );
        }
        else
        {
            nIters = 0;
            for ( m = 0; m < pStr->nVarIns; m++, iLit++ )
                if ( !Abc_LitIsCompl(Vec_IntEntry(vLits, iLit)) )
                {
                    pStr->Res = pStr->VarIns[m];
                    nIters++;
                }
            assert( nIters == 1 );
        }
    }
    assert( iLit == Vec_IntSize(vLits) );
}